

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O2

DisasJumpType op_vle(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  uint64_t uVar1;
  TCGv_i64 addr;
  uint uVar2;
  uint uVar3;
  int reg;
  TCGv_i64 val;
  DisasJumpType DVar4;
  uintptr_t o_1;
  MemOp_conflict memop;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = s->insn->data;
  DVar4 = DISAS_NORETURN;
  uVar2 = get_field1(s,FLD_O_m3,FLD_C_i3);
  if ((0x10U >> ((byte)uVar1 & 0x1f)) - 1 < (uVar2 & 0xff)) {
    gen_program_exception(s,6);
  }
  else {
    memop = (MemOp_conflict)uVar1 & 0xff;
    val = tcg_temp_new_i64(tcg_ctx);
    addr = o->addr1;
    uVar3 = get_mem_index(s);
    tcg_gen_qemu_ld_i64_s390x(tcg_ctx,val,addr,(ulong)uVar3,memop | MO_BE);
    DVar4 = DISAS_NEXT;
    reg = get_field1(s,FLD_O_v1,FLD_C_b1);
    write_vec_element_i64(tcg_ctx,val,reg,(uint8_t)uVar2,memop);
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(val + (long)tcg_ctx));
  }
  return DVar4;
}

Assistant:

static DisasJumpType op_vle(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t es = s->insn->data;
    const uint8_t enr = get_field(s, m3);
    TCGv_i64 tmp;

    if (!valid_vec_element(enr, es)) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    tmp = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_qemu_ld_i64(tcg_ctx, tmp, o->addr1, get_mem_index(s), MO_TE | es);
    write_vec_element_i64(tcg_ctx, tmp, get_field(s, v1), enr, es);
    tcg_temp_free_i64(tcg_ctx, tmp);
    return DISAS_NEXT;
}